

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

wally_psbt * cfd::core::MergePsbt(void *src,void *dest,bool ignore_duplicate_error)

{
  long lVar1;
  wally_psbt *pwVar2;
  int iVar3;
  CfdException *pCVar4;
  allocator local_51;
  wally_psbt *psbt;
  undefined1 local_48 [36];
  int ret;
  
  lVar1 = *(long *)((long)src + 8);
  if (((lVar1 == 0) || (*(long *)((long)src + 0x18) != *(long *)(lVar1 + 0x10))) ||
     (*(long *)((long)src + 0x30) != *(long *)(lVar1 + 0x28))) {
    local_48._0_8_ = "cfdcore_psbt.cpp";
    local_48._8_4_ = 0x2d1;
    local_48._16_8_ = "MergePsbt";
    logger::warn<>((CfdSourceLocation *)local_48,"psbt src format error.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_48,"psbt src format error.",(allocator *)&psbt);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar1 = *(long *)((long)dest + 8);
  if (((lVar1 != 0) && (*(long *)((long)dest + 0x18) == *(long *)(lVar1 + 0x10))) &&
     (*(long *)((long)dest + 0x30) == *(long *)(lVar1 + 0x28))) {
    psbt = (wally_psbt *)0x0;
    ret = wally_psbt_clone_alloc((wally_psbt *)src,0,&psbt);
    pwVar2 = psbt;
    if (ret != 0) {
      local_48._0_8_ = "cfdcore_psbt.cpp";
      local_48._8_4_ = 0x2de;
      local_48._16_8_ = "MergePsbt";
      logger::warn<int&>((CfdSourceLocation *)local_48,"wally_psbt_clone_alloc NG[{}]",&ret);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_48,"psbt clone error.",&local_51);
      CfdException::CfdException(pCVar4,kCfdMemoryFullError,(string *)local_48);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar3 = bcmp(psbt,dest,5);
    if (iVar3 == 0) {
      if (pwVar2->version == *(uint32_t *)((long)dest + 0x58)) {
        ::std::__cxx11::string::string((string *)local_48,"global unknowns",&local_51);
        MergeWallyMap(&pwVar2->unknowns,(wally_map *)((long)dest + 0x40),(string *)local_48,
                      ignore_duplicate_error);
        ::std::__cxx11::string::~string((string *)local_48);
        MergePsbtInputs(psbt,(wally_psbt *)dest,ignore_duplicate_error);
        MergePsbtOutputs(psbt,(wally_psbt *)dest,ignore_duplicate_error);
        return psbt;
      }
      local_48._0_8_ = "cfdcore_psbt.cpp";
      local_48._8_4_ = 0x2ea;
      local_48._16_8_ = "MergePsbt";
      logger::warn<unsigned_int&,unsigned_int_const&>
                ((CfdSourceLocation *)local_48,"psbt unmatch version: [{},{}]",&pwVar2->version,
                 (uint *)((long)dest + 0x58));
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_48,"psbt unmatch version error.",&local_51);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_48);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_48._0_8_ = "cfdcore_psbt.cpp";
    local_48._8_4_ = 0x2e4;
    local_48._16_8_ = "MergePsbt";
    logger::warn<>((CfdSourceLocation *)local_48,"psbt unmatch magic.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_48,"psbt unmatch magic error.",&local_51);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_48._0_8_ = "cfdcore_psbt.cpp";
  local_48._8_4_ = 0x2d7;
  local_48._16_8_ = "MergePsbt";
  logger::warn<>((CfdSourceLocation *)local_48,"psbt dest format error.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_48,"psbt dest format error.",(allocator *)&psbt);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

struct wally_psbt *MergePsbt(
    const void *src, const void *dest, bool ignore_duplicate_error) {
  const struct wally_psbt *psbt_src =
      static_cast<const struct wally_psbt *>(src);
  const struct wally_psbt *psbt_dest =
      static_cast<const struct wally_psbt *>(dest);

  if ((psbt_src->tx == nullptr) ||
      (psbt_src->num_inputs != psbt_src->tx->num_inputs) ||
      (psbt_src->num_outputs != psbt_src->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt src format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt src format error.");
  }
  if ((psbt_dest->tx == nullptr) ||
      (psbt_dest->num_inputs != psbt_dest->tx->num_inputs) ||
      (psbt_dest->num_outputs != psbt_dest->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt dest format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt dest format error.");
  }

  struct wally_psbt *psbt = nullptr;
  int ret = wally_psbt_clone_alloc(psbt_src, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt clone error.");
  }

  try {
    if (memcmp(psbt->magic, psbt_dest->magic, sizeof(psbt->magic)) != 0) {
      warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch magic error.");
    }
    if (psbt->version != psbt_dest->version) {
      warn(
          CFD_LOG_SOURCE, "psbt unmatch version: [{},{}]", psbt->version,
          psbt_dest->version);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch version error.");
    }
    MergeWallyMap(
        &psbt->unknowns, &psbt_dest->unknowns, "global unknowns",
        ignore_duplicate_error);

    MergePsbtInputs(psbt, psbt_dest, ignore_duplicate_error);
    MergePsbtOutputs(psbt, psbt_dest, ignore_duplicate_error);
  } catch (const CfdException &except) {
    wally_psbt_free(psbt);
    throw except;
  }
  return psbt;
}